

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O1

void __thiscall Assimp::ObjExporter::AddNode(ObjExporter *this,aiNode *nd,aiMatrix4x4 *mParent)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  aiMesh *m;
  aiNode *name;
  ulong uVar29;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 local_98;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  uVar13 = mParent->a1;
  uVar14 = mParent->a2;
  uVar15 = mParent->a3;
  uVar16 = mParent->a4;
  uVar17 = mParent->b1;
  uVar18 = mParent->b2;
  uVar19 = mParent->b3;
  uVar20 = mParent->b4;
  uVar21 = mParent->c1;
  uVar22 = mParent->c2;
  uVar23 = mParent->c3;
  uVar24 = mParent->c4;
  uVar25 = mParent->d1;
  uVar26 = mParent->d2;
  uVar27 = mParent->d3;
  uVar28 = mParent->d4;
  local_44 = (nd->mTransformation).b1;
  fVar1 = (nd->mTransformation).a1;
  local_4c = (nd->mTransformation).a2;
  fVar2 = (nd->mTransformation).c1;
  local_48 = (nd->mTransformation).d1;
  local_24 = local_48 * (float)uVar16 +
             fVar2 * (float)uVar15 + fVar1 * (float)uVar13 + local_44 * (float)uVar14;
  fVar3 = (nd->mTransformation).b2;
  fVar4 = (nd->mTransformation).c2;
  fVar5 = (nd->mTransformation).d2;
  local_28 = fVar5 * (float)uVar16 +
             fVar4 * (float)uVar15 + local_4c * (float)uVar13 + (float)uVar14 * fVar3;
  fVar6 = (nd->mTransformation).b3;
  fVar7 = (nd->mTransformation).a3;
  fVar8 = (nd->mTransformation).c3;
  fVar9 = (nd->mTransformation).d3;
  local_2c = fVar9 * (float)uVar16 +
             fVar8 * (float)uVar15 + fVar7 * (float)uVar13 + (float)uVar14 * fVar6;
  fVar10 = (nd->mTransformation).b4;
  fVar11 = (nd->mTransformation).a4;
  fVar12 = (nd->mTransformation).c4;
  local_50 = (nd->mTransformation).d4;
  local_30 = (float)uVar16 * local_50 +
             (float)uVar15 * fVar12 + (float)uVar13 * fVar11 + (float)uVar14 * fVar10;
  local_34 = local_48 * (float)uVar20 +
             fVar2 * (float)uVar19 + fVar1 * (float)uVar17 + local_44 * (float)uVar18;
  local_38 = fVar5 * (float)uVar20 +
             fVar4 * (float)uVar19 + local_4c * (float)uVar17 + fVar3 * (float)uVar18;
  local_3c = fVar9 * (float)uVar20 +
             fVar8 * (float)uVar19 + fVar7 * (float)uVar17 + fVar6 * (float)uVar18;
  local_40 = local_48 * (float)uVar24 +
             fVar2 * (float)uVar23 + fVar1 * (float)uVar21 + local_44 * (float)uVar22;
  local_98.a2 = local_28;
  local_98.a1 = local_24;
  local_98.a4 = local_30;
  local_98.a3 = local_2c;
  local_98.b2 = local_38;
  local_98.b1 = local_34;
  local_98.b4 = (float)uVar20 * local_50 +
                (float)uVar19 * fVar12 + (float)uVar17 * fVar11 + (float)uVar18 * fVar10;
  local_98.b3 = local_3c;
  local_98.c2 = fVar5 * (float)uVar24 +
                fVar4 * (float)uVar23 + local_4c * (float)uVar21 + fVar3 * (float)uVar22;
  local_98.c1 = local_40;
  local_98.c4 = (float)uVar24 * local_50 +
                (float)uVar23 * fVar12 + (float)uVar21 * fVar11 + (float)uVar22 * fVar10;
  local_98.c3 = fVar9 * (float)uVar24 +
                fVar8 * (float)uVar23 + fVar7 * (float)uVar21 + fVar6 * (float)uVar22;
  local_98.d2 = fVar5 * (float)uVar28 +
                fVar4 * (float)uVar27 + local_4c * (float)uVar25 + fVar3 * (float)uVar26;
  local_98.d1 = local_48 * (float)uVar28 +
                fVar2 * (float)uVar27 + fVar1 * (float)uVar25 + local_44 * (float)uVar26;
  local_98.d4 = local_50 * (float)uVar28 +
                fVar12 * (float)uVar27 + fVar11 * (float)uVar25 + fVar10 * (float)uVar26;
  local_98.d3 = fVar9 * (float)uVar28 +
                fVar8 * (float)uVar27 + fVar7 * (float)uVar25 + fVar6 * (float)uVar26;
  if (nd->mNumMeshes != 0) {
    uVar29 = 0;
    do {
      m = this->pScene->mMeshes[nd->mMeshes[uVar29]];
      if (m == (aiMesh *)0x0) {
        m = (aiMesh *)0x0;
        name = nd;
      }
      else {
        name = (aiNode *)&m->mName;
      }
      AddMesh(this,&name->mName,m,&local_98);
      uVar29 = uVar29 + 1;
    } while (uVar29 < nd->mNumMeshes);
  }
  if (nd->mNumChildren != 0) {
    uVar29 = 0;
    do {
      AddNode(this,nd->mChildren[uVar29],&local_98);
      uVar29 = uVar29 + 1;
    } while (uVar29 < nd->mNumChildren);
  }
  return;
}

Assistant:

void ObjExporter::AddNode(const aiNode* nd, const aiMatrix4x4& mParent) {
    const aiMatrix4x4& mAbs = mParent * nd->mTransformation;

    aiMesh *cm( nullptr );
    for(unsigned int i = 0; i < nd->mNumMeshes; ++i) {
        cm = pScene->mMeshes[nd->mMeshes[i]];
        if (nullptr != cm) {
            AddMesh(cm->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        } else {
            AddMesh(nd->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        }
    }

    for(unsigned int i = 0; i < nd->mNumChildren; ++i) {
        AddNode(nd->mChildren[i], mAbs);
    }
}